

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  StackItemT<embree::NodeRefPtr<4>_> *pSVar1;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar2;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar3;
  float *pfVar4;
  int iVar5;
  AccelData *pAVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  size_t sVar11;
  undefined8 uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  _func_int **pp_Var17;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar18;
  undefined4 uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  NodeRef nodeRef;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar31 [64];
  vint4 bi;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 bi_1;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 ai_3;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vint4 bi_2;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  vint4 bi_3;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 bi_5;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 ai_2;
  undefined1 auVar60 [16];
  vint4 bi_4;
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  vint<4> octant;
  vint4 bi_10;
  RTCIntersectFunctionNArguments local_11a8;
  Geometry *local_1178;
  undefined8 local_1170;
  RTCIntersectArguments *local_1168;
  undefined1 local_1158 [16];
  vfloat<4> fmin;
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [8];
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  undefined1 local_1008 [16];
  undefined1 local_ff8 [8];
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [8];
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [8];
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [8];
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  auVar27 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar29 = vpcmpeqd_avx(auVar27,(undefined1  [16])valid_i->field_0);
  uVar13 = vmovmskps_avx(auVar29);
  if (uVar13 == 0) {
    return;
  }
  pAVar6 = This->ptr;
  uVar20 = (ulong)(uVar13 & 0xff);
  auVar64 = ZEXT1664(*(undefined1 (*) [16])ray);
  auVar65 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
  auVar66 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
  auVar28 = *(undefined1 (*) [16])(ray + 0x40);
  auVar41._8_4_ = 0x7fffffff;
  auVar41._0_8_ = 0x7fffffff7fffffff;
  auVar41._12_4_ = 0x7fffffff;
  auVar32 = vandps_avx(auVar28,auVar41);
  auVar53._8_4_ = 0x219392ef;
  auVar53._0_8_ = 0x219392ef219392ef;
  auVar53._12_4_ = 0x219392ef;
  auVar32 = vcmpps_avx(auVar32,auVar53,1);
  auVar43 = vblendvps_avx(auVar28,auVar53,auVar32);
  auVar32 = *(undefined1 (*) [16])(ray + 0x50);
  auVar49 = vandps_avx(auVar32,auVar41);
  auVar49 = vcmpps_avx(auVar49,auVar53,1);
  auVar42 = vblendvps_avx(auVar32,auVar53,auVar49);
  auVar49 = *(undefined1 (*) [16])(ray + 0x60);
  auVar41 = vandps_avx(auVar49,auVar41);
  auVar41 = vcmpps_avx(auVar41,auVar53,1);
  auVar41 = vblendvps_avx(auVar49,auVar53,auVar41);
  auVar48 = vrcpps_avx(auVar43);
  fVar7 = auVar48._0_4_;
  auVar47._0_4_ = auVar43._0_4_ * fVar7;
  fVar8 = auVar48._4_4_;
  auVar47._4_4_ = auVar43._4_4_ * fVar8;
  fVar9 = auVar48._8_4_;
  auVar47._8_4_ = auVar43._8_4_ * fVar9;
  fVar10 = auVar48._12_4_;
  auVar47._12_4_ = auVar43._12_4_ * fVar10;
  auVar62._8_4_ = 0x3f800000;
  auVar62._0_8_ = 0x3f8000003f800000;
  auVar62._12_4_ = 0x3f800000;
  auVar43 = vsubps_avx(auVar62,auVar47);
  local_10a8._0_4_ = fVar7 + fVar7 * auVar43._0_4_;
  local_10a8._4_4_ = fVar8 + fVar8 * auVar43._4_4_;
  local_10a8._8_4_ = fVar9 + fVar9 * auVar43._8_4_;
  local_10a8._12_4_ = fVar10 + fVar10 * auVar43._12_4_;
  auVar67 = ZEXT1664(local_10a8);
  auVar43 = vrcpps_avx(auVar42);
  fVar7 = auVar43._0_4_;
  auVar54._0_4_ = auVar42._0_4_ * fVar7;
  fVar8 = auVar43._4_4_;
  auVar54._4_4_ = auVar42._4_4_ * fVar8;
  fVar9 = auVar43._8_4_;
  auVar54._8_4_ = auVar42._8_4_ * fVar9;
  fVar10 = auVar43._12_4_;
  auVar54._12_4_ = auVar42._12_4_ * fVar10;
  auVar43 = vsubps_avx(auVar62,auVar54);
  local_10b8._0_4_ = fVar7 + fVar7 * auVar43._0_4_;
  local_10b8._4_4_ = fVar8 + fVar8 * auVar43._4_4_;
  local_10b8._8_4_ = fVar9 + fVar9 * auVar43._8_4_;
  local_10b8._12_4_ = fVar10 + fVar10 * auVar43._12_4_;
  auVar68 = ZEXT1664(local_10b8);
  auVar43 = vrcpps_avx(auVar41);
  fVar7 = auVar43._0_4_;
  auVar42._0_4_ = auVar41._0_4_ * fVar7;
  fVar8 = auVar43._4_4_;
  auVar42._4_4_ = auVar41._4_4_ * fVar8;
  fVar9 = auVar43._8_4_;
  auVar42._8_4_ = auVar41._8_4_ * fVar9;
  fVar10 = auVar43._12_4_;
  auVar42._12_4_ = auVar41._12_4_ * fVar10;
  auVar41 = vsubps_avx(auVar62,auVar42);
  local_10c8._0_4_ = fVar7 + fVar7 * auVar41._0_4_;
  local_10c8._4_4_ = fVar8 + fVar8 * auVar41._4_4_;
  local_10c8._8_4_ = fVar9 + fVar9 * auVar41._8_4_;
  local_10c8._12_4_ = fVar10 + fVar10 * auVar41._12_4_;
  auVar63 = ZEXT1664(local_10c8);
  auVar41 = ZEXT416(0) << 0x20;
  local_10d8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar41);
  local_10e8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar41);
  auVar28 = vcmpps_avx(auVar28,auVar41,1);
  auVar43._8_4_ = 1;
  auVar43._0_8_ = 0x100000001;
  auVar43._12_4_ = 1;
  auVar28 = vandps_avx(auVar28,auVar43);
  auVar32 = vcmpps_avx(auVar32,auVar41,1);
  auVar48._8_4_ = 2;
  auVar48._0_8_ = 0x200000002;
  auVar48._12_4_ = 2;
  auVar32 = vandps_avx(auVar32,auVar48);
  auVar32 = vorps_avx(auVar32,auVar28);
  auVar28 = vcmpps_avx(auVar49,auVar41,1);
  auVar49._8_4_ = 4;
  auVar49._0_8_ = 0x400000004;
  auVar49._12_4_ = 4;
  auVar28 = vandps_avx(auVar28,auVar49);
  auVar27 = vpor_avx(auVar29 ^ auVar27,auVar28);
  local_10f8 = vpor_avx(auVar27,auVar32);
  auVar61 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  local_1078 = *(undefined1 (*) [16])ray;
  local_1088 = *(undefined1 (*) [16])(ray + 0x10);
  local_1098 = *(undefined1 (*) [16])(ray + 0x20);
LAB_00f189c5:
  lVar21 = 0;
  if (uVar20 != 0) {
    for (; (uVar20 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
    }
  }
  uVar19 = *(undefined4 *)(local_10f8 + lVar21 * 4);
  auVar27._4_4_ = uVar19;
  auVar27._0_4_ = uVar19;
  auVar27._8_4_ = uVar19;
  auVar27._12_4_ = uVar19;
  auVar48 = vpcmpeqd_avx(auVar27,local_10f8);
  uVar19 = vmovmskps_avx(auVar48);
  uVar20 = ~CONCAT44((int)((ulong)lVar21 >> 0x20),uVar19) & uVar20;
  auVar42 = auVar61._0_16_;
  auVar27 = vblendvps_avx(auVar42,auVar64._0_16_,auVar48);
  auVar29 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vminps_avx(auVar29,auVar27);
  auVar29 = vshufpd_avx(auVar27,auVar27,1);
  auVar29 = vminps_avx(auVar29,auVar27);
  auVar27 = vblendvps_avx(auVar42,auVar65._0_16_,auVar48);
  auVar28 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vminps_avx(auVar28,auVar27);
  auVar28 = vshufpd_avx(auVar27,auVar27,1);
  auVar28 = vminps_avx(auVar28,auVar27);
  auVar27 = vblendvps_avx(auVar42,auVar66._0_16_,auVar48);
  auVar29 = vinsertps_avx(auVar29,auVar28,0x1c);
  auVar28 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vminps_avx(auVar28,auVar27);
  auVar28 = vshufpd_avx(auVar27,auVar27,1);
  auVar27 = vminps_avx(auVar28,auVar27);
  auVar28 = vinsertps_avx(auVar29,auVar27,0x20);
  auVar60._8_4_ = 0xff800000;
  auVar60._0_8_ = 0xff800000ff800000;
  auVar60._12_4_ = 0xff800000;
  auVar27 = vblendvps_avx(auVar60,auVar64._0_16_,auVar48);
  auVar29 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vmaxps_avx(auVar29,auVar27);
  auVar29 = vshufpd_avx(auVar27,auVar27,1);
  auVar29 = vmaxps_avx(auVar29,auVar27);
  auVar27 = vblendvps_avx(auVar60,auVar65._0_16_,auVar48);
  auVar32 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vmaxps_avx(auVar32,auVar27);
  auVar32 = vshufpd_avx(auVar27,auVar27,1);
  auVar32 = vmaxps_avx(auVar32,auVar27);
  auVar27 = vblendvps_avx(auVar60,auVar66._0_16_,auVar48);
  auVar29 = vinsertps_avx(auVar29,auVar32,0x1c);
  auVar32 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vmaxps_avx(auVar32,auVar27);
  auVar32 = vshufpd_avx(auVar27,auVar27,1);
  auVar27 = vmaxps_avx(auVar32,auVar27);
  auVar49 = vinsertps_avx(auVar29,auVar27,0x20);
  auVar27 = vblendvps_avx(auVar42,auVar67._0_16_,auVar48);
  auVar29 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vminps_avx(auVar29,auVar27);
  auVar29 = vshufpd_avx(auVar27,auVar27,1);
  auVar29 = vminps_avx(auVar29,auVar27);
  auVar27 = vblendvps_avx(auVar42,auVar68._0_16_,auVar48);
  auVar32 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vminps_avx(auVar32,auVar27);
  auVar32 = vshufpd_avx(auVar27,auVar27,1);
  auVar32 = vminps_avx(auVar32,auVar27);
  auVar27 = vblendvps_avx(auVar42,auVar63._0_16_,auVar48);
  auVar29 = vinsertps_avx(auVar29,auVar32,0x1c);
  auVar32 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vminps_avx(auVar32,auVar27);
  auVar32 = vshufpd_avx(auVar27,auVar27,1);
  auVar27 = vminps_avx(auVar32,auVar27);
  auVar41 = vinsertps_avx(auVar29,auVar27,0x20);
  auVar27 = vblendvps_avx(auVar60,auVar67._0_16_,auVar48);
  auVar29 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vmaxps_avx(auVar29,auVar27);
  auVar29 = vshufpd_avx(auVar27,auVar27,1);
  auVar29 = vmaxps_avx(auVar29,auVar27);
  auVar27 = vblendvps_avx(auVar60,auVar68._0_16_,auVar48);
  auVar32 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vmaxps_avx(auVar32,auVar27);
  auVar32 = vshufpd_avx(auVar27,auVar27,1);
  auVar32 = vmaxps_avx(auVar32,auVar27);
  auVar27 = vblendvps_avx(auVar60,auVar63._0_16_,auVar48);
  auVar29 = vinsertps_avx(auVar29,auVar32,0x1c);
  auVar32 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vmaxps_avx(auVar32,auVar27);
  auVar32 = vshufpd_avx(auVar27,auVar27,1);
  auVar27 = vmaxps_avx(auVar32,auVar27);
  auVar43 = vinsertps_avx(auVar29,auVar27,0x20);
  local_f88 = vblendvps_avx(auVar42,local_10d8,auVar48);
  auVar27 = vshufps_avx(local_f88,local_f88,0xb1);
  auVar42 = vminps_avx(auVar27,local_f88);
  bi_10.field_0 =
       (anon_union_16_2_9473010e_for_vint_impl<4>_1)vblendvps_avx(auVar60,local_10e8,auVar48);
  auVar48 = vshufps_avx((undefined1  [16])bi_10.field_0,(undefined1  [16])bi_10.field_0,0xb1);
  auVar32 = vcmpps_avx(auVar41,_DAT_01f45a50,5);
  auVar27 = vblendvps_avx(auVar43,auVar41,auVar32);
  auVar29 = vblendvps_avx(auVar28,auVar49,auVar32);
  auVar28 = vblendvps_avx(auVar49,auVar28,auVar32);
  auVar49 = vmaxps_avx(auVar48,(undefined1  [16])bi_10.field_0);
  auVar48 = vmovshdup_avx(auVar27);
  uVar25 = (ulong)(auVar48._0_4_ < 0.0) << 4 | 0x20;
  auVar48 = vshufpd_avx(auVar27,auVar27,1);
  auVar47 = vshufpd_avx(auVar49,auVar49,1);
  uVar26 = (ulong)(auVar48._0_4_ < 0.0) << 4 | 0x40;
  auVar49 = vmaxss_avx(auVar47,auVar49);
  auVar32 = vblendvps_avx(auVar41,auVar43,auVar32);
  auVar55._0_4_ = auVar29._0_4_ * auVar27._0_4_;
  auVar55._4_4_ = auVar29._4_4_ * auVar27._4_4_;
  auVar55._8_4_ = auVar29._8_4_ * auVar27._8_4_;
  auVar55._12_4_ = auVar29._12_4_ * auVar27._12_4_;
  auVar50._0_4_ = auVar28._0_4_ * auVar32._0_4_;
  auVar50._4_4_ = auVar28._4_4_ * auVar32._4_4_;
  auVar50._8_4_ = auVar28._8_4_ * auVar32._8_4_;
  auVar50._12_4_ = auVar28._12_4_ * auVar32._12_4_;
  uVar24 = (ulong)(auVar27._0_4_ < 0.0) * 0x10;
  stack[0].ptr.ptr = *(size_t *)&pAVar6[1].bounds.bounds0.lower.field_0;
  stack[0].dist = 0;
  _local_f98 = vshufps_avx(auVar27,auVar27,0);
  local_fa8 = vshufps_avx(auVar55,auVar55,0);
  _local_fb8 = vshufps_avx(auVar27,auVar27,0x55);
  local_fc8 = vshufps_avx(auVar55,auVar55,0x55);
  _local_fd8 = vshufps_avx(auVar27,auVar27,0xaa);
  local_fe8 = vshufps_avx(auVar55,auVar55,0xaa);
  _local_ff8 = vshufps_avx(auVar32,auVar32,0);
  local_1008 = vshufps_avx(auVar50,auVar50,0);
  _local_1018 = vshufps_avx(auVar32,auVar32,0x55);
  auVar27 = vshufps_avx(auVar42,auVar42,0);
  auVar29 = vshufps_avx(auVar42,auVar42,0xaa);
  local_1028 = vminps_avx(auVar29,auVar27);
  local_1038 = vshufps_avx(auVar50,auVar50,0x55);
  _local_1048 = vshufps_avx(auVar32,auVar32,0xaa);
  local_1058 = vshufps_avx(auVar50,auVar50,0xaa);
  pSVar18 = stack + 1;
  do {
    local_1158 = vshufps_avx(auVar49,auVar49,0);
LAB_00f18d0f:
    do {
      do {
        do {
          if (pSVar18 == stack) {
            if (uVar20 == 0) {
              return;
            }
            goto LAB_00f189c5;
          }
          uVar13 = pSVar18[-1].dist;
          auVar29._4_4_ = uVar13;
          auVar29._0_4_ = uVar13;
          auVar29._8_4_ = uVar13;
          auVar29._12_4_ = uVar13;
          auVar31 = ZEXT1664(auVar29);
          pSVar18 = pSVar18 + -1;
          auVar27 = vcmpps_avx(auVar29,(undefined1  [16])bi_10.field_0,1);
        } while ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                  (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 -1 < auVar27[0xf]);
        uVar14 = (pSVar18->ptr).ptr;
        while ((uVar14 & 8) == 0) {
          pfVar4 = (float *)(uVar14 + 0x20 + uVar24);
          auVar28._0_4_ = (float)local_f98._0_4_ * *pfVar4;
          auVar28._4_4_ = (float)local_f98._4_4_ * pfVar4[1];
          auVar28._8_4_ = fStack_f90 * pfVar4[2];
          auVar28._12_4_ = fStack_f8c * pfVar4[3];
          pfVar4 = (float *)(uVar14 + 0x20 + uVar25);
          auVar32._0_4_ = (float)local_fb8._0_4_ * *pfVar4;
          auVar32._4_4_ = (float)local_fb8._4_4_ * pfVar4[1];
          auVar32._8_4_ = fStack_fb0 * pfVar4[2];
          auVar32._12_4_ = fStack_fac * pfVar4[3];
          auVar27 = vsubps_avx(auVar28,local_fa8);
          auVar29 = vsubps_avx(auVar32,local_fc8);
          pfVar4 = (float *)(uVar14 + 0x20 + uVar26);
          auVar37._0_4_ = (float)local_fd8._0_4_ * *pfVar4;
          auVar37._4_4_ = (float)local_fd8._4_4_ * pfVar4[1];
          auVar37._8_4_ = fStack_fd0 * pfVar4[2];
          auVar37._12_4_ = fStack_fcc * pfVar4[3];
          auVar27 = vpmaxsd_avx(auVar27,auVar29);
          auVar29 = vsubps_avx(auVar37,local_fe8);
          auVar29 = vpmaxsd_avx(auVar29,local_1028);
          fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vpmaxsd_avx(auVar27,auVar29)
          ;
          pfVar4 = (float *)(uVar14 + 0x20 + (uVar24 ^ 0x10));
          auVar33._0_4_ = (float)local_ff8._0_4_ * *pfVar4;
          auVar33._4_4_ = (float)local_ff8._4_4_ * pfVar4[1];
          auVar33._8_4_ = fStack_ff0 * pfVar4[2];
          auVar33._12_4_ = fStack_fec * pfVar4[3];
          pfVar4 = (float *)(uVar14 + 0x20 + (uVar25 ^ 0x10));
          auVar38._0_4_ = (float)local_1018._0_4_ * *pfVar4;
          auVar38._4_4_ = (float)local_1018._4_4_ * pfVar4[1];
          auVar38._8_4_ = fStack_1010 * pfVar4[2];
          auVar38._12_4_ = fStack_100c * pfVar4[3];
          auVar27 = vsubps_avx(auVar33,local_1008);
          auVar29 = vsubps_avx(auVar38,local_1038);
          pfVar4 = (float *)(uVar14 + 0x20 + (uVar26 ^ 0x10));
          auVar44._0_4_ = (float)local_1048._0_4_ * *pfVar4;
          auVar44._4_4_ = (float)local_1048._4_4_ * pfVar4[1];
          auVar44._8_4_ = fStack_1040 * pfVar4[2];
          auVar44._12_4_ = fStack_103c * pfVar4[3];
          auVar27 = vpminsd_avx(auVar27,auVar29);
          auVar29 = vsubps_avx(auVar44,local_1058);
          auVar29 = vpminsd_avx(auVar29,local_1158);
          auVar27 = vpminsd_avx(auVar27,auVar29);
          auVar27 = vcmpps_avx((undefined1  [16])fmin.field_0,auVar27,2);
          uVar13 = vmovmskps_avx(auVar27);
          if (uVar13 == 0) goto LAB_00f18d0f;
          uVar22 = (ulong)(uVar13 & 0xff);
          auVar31 = ZEXT1664(auVar61._0_16_);
          uVar23 = 0;
          uVar15 = 8;
          do {
            lVar21 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            uVar19 = *(undefined4 *)(uVar14 + 0x20 + lVar21 * 4);
            auVar34._4_4_ = uVar19;
            auVar34._0_4_ = uVar19;
            auVar34._8_4_ = uVar19;
            auVar34._12_4_ = uVar19;
            auVar27 = vsubps_avx(auVar34,auVar64._0_16_);
            auVar35._0_4_ = auVar67._0_4_ * auVar27._0_4_;
            auVar35._4_4_ = auVar67._4_4_ * auVar27._4_4_;
            auVar35._8_4_ = auVar67._8_4_ * auVar27._8_4_;
            auVar35._12_4_ = auVar67._12_4_ * auVar27._12_4_;
            uVar19 = *(undefined4 *)(uVar14 + 0x40 + lVar21 * 4);
            auVar39._4_4_ = uVar19;
            auVar39._0_4_ = uVar19;
            auVar39._8_4_ = uVar19;
            auVar39._12_4_ = uVar19;
            auVar27 = vsubps_avx(auVar39,auVar65._0_16_);
            auVar40._0_4_ = auVar68._0_4_ * auVar27._0_4_;
            auVar40._4_4_ = auVar68._4_4_ * auVar27._4_4_;
            auVar40._8_4_ = auVar68._8_4_ * auVar27._8_4_;
            auVar40._12_4_ = auVar68._12_4_ * auVar27._12_4_;
            uVar19 = *(undefined4 *)(uVar14 + 0x60 + lVar21 * 4);
            auVar45._4_4_ = uVar19;
            auVar45._0_4_ = uVar19;
            auVar45._8_4_ = uVar19;
            auVar45._12_4_ = uVar19;
            auVar27 = vsubps_avx(auVar45,auVar66._0_16_);
            auVar46._0_4_ = auVar63._0_4_ * auVar27._0_4_;
            auVar46._4_4_ = auVar63._4_4_ * auVar27._4_4_;
            auVar46._8_4_ = auVar63._8_4_ * auVar27._8_4_;
            auVar46._12_4_ = auVar63._12_4_ * auVar27._12_4_;
            uVar19 = *(undefined4 *)(uVar14 + 0x30 + lVar21 * 4);
            auVar51._4_4_ = uVar19;
            auVar51._0_4_ = uVar19;
            auVar51._8_4_ = uVar19;
            auVar51._12_4_ = uVar19;
            auVar27 = vsubps_avx(auVar51,auVar64._0_16_);
            auVar52._0_4_ = auVar67._0_4_ * auVar27._0_4_;
            auVar52._4_4_ = auVar67._4_4_ * auVar27._4_4_;
            auVar52._8_4_ = auVar67._8_4_ * auVar27._8_4_;
            auVar52._12_4_ = auVar67._12_4_ * auVar27._12_4_;
            uVar19 = *(undefined4 *)(uVar14 + 0x50 + lVar21 * 4);
            auVar56._4_4_ = uVar19;
            auVar56._0_4_ = uVar19;
            auVar56._8_4_ = uVar19;
            auVar56._12_4_ = uVar19;
            auVar27 = vsubps_avx(auVar56,auVar65._0_16_);
            auVar57._0_4_ = auVar68._0_4_ * auVar27._0_4_;
            auVar57._4_4_ = auVar68._4_4_ * auVar27._4_4_;
            auVar57._8_4_ = auVar68._8_4_ * auVar27._8_4_;
            auVar57._12_4_ = auVar68._12_4_ * auVar27._12_4_;
            uVar19 = *(undefined4 *)(uVar14 + 0x70 + lVar21 * 4);
            auVar58._4_4_ = uVar19;
            auVar58._0_4_ = uVar19;
            auVar58._8_4_ = uVar19;
            auVar58._12_4_ = uVar19;
            auVar27 = vsubps_avx(auVar58,auVar66._0_16_);
            auVar59._0_4_ = auVar63._0_4_ * auVar27._0_4_;
            auVar59._4_4_ = auVar63._4_4_ * auVar27._4_4_;
            auVar59._8_4_ = auVar63._8_4_ * auVar27._8_4_;
            auVar59._12_4_ = auVar63._12_4_ * auVar27._12_4_;
            auVar27 = vpminsd_avx(auVar35,auVar52);
            auVar29 = vpminsd_avx(auVar40,auVar57);
            auVar27 = vpmaxsd_avx(auVar27,auVar29);
            auVar32 = vpminsd_avx(auVar46,auVar59);
            auVar29 = vpmaxsd_avx(auVar35,auVar52);
            auVar28 = vpmaxsd_avx(auVar40,auVar57);
            auVar49 = vpminsd_avx(auVar29,auVar28);
            auVar29 = vpmaxsd_avx(auVar46,auVar59);
            auVar28 = vpmaxsd_avx(auVar32,local_f88);
            auVar27 = vpmaxsd_avx(auVar27,auVar28);
            auVar29 = vpminsd_avx(auVar29,(undefined1  [16])bi_10.field_0);
            auVar29 = vpminsd_avx(auVar49,auVar29);
            auVar27 = vcmpps_avx(auVar27,auVar29,2);
            uVar16 = uVar15;
            if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar27[0xf] < '\0') {
              iVar5 = fmin.field_0.i[lVar21];
              auVar36._4_4_ = iVar5;
              auVar36._0_4_ = iVar5;
              auVar36._8_4_ = iVar5;
              auVar36._12_4_ = iVar5;
              uVar16 = *(ulong *)(uVar14 + lVar21 * 8);
              auVar29 = auVar31._0_16_;
              auVar27 = vcmpps_avx(auVar36,auVar29,1);
              if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar27[0xf]) {
                (pSVar18->ptr).ptr = uVar16;
                uVar16 = uVar15;
              }
              else {
                if (uVar15 == 8) {
                  auVar31 = ZEXT1664(auVar36);
                  goto LAB_00f18f27;
                }
                (pSVar18->ptr).ptr = uVar15;
                auVar31 = ZEXT1664(auVar36);
                auVar36 = auVar29;
              }
              uVar23 = uVar23 + 1;
              pSVar18->dist = auVar36._0_4_;
              pSVar18 = pSVar18 + 1;
            }
LAB_00f18f27:
            uVar22 = uVar22 & uVar22 - 1;
            uVar15 = uVar16;
          } while (uVar22 != 0);
          if (uVar16 == 8) goto LAB_00f18d0f;
          uVar14 = uVar16;
          if (1 < uVar23) {
            pSVar1 = pSVar18 + -2;
            pSVar2 = pSVar18 + -1;
            if (pSVar18[-2].dist < pSVar18[-1].dist) {
              sVar11 = (pSVar1->ptr).ptr;
              uVar12 = *(undefined8 *)&pSVar18[-2].dist;
              pSVar18[-2].dist = pSVar18[-1].dist;
              (pSVar1->ptr).ptr = (pSVar2->ptr).ptr;
              (pSVar2->ptr).ptr = sVar11;
              local_11a8.geometryUserPtr._0_4_ = (uint)uVar12;
              pSVar18[-1].dist = (uint)local_11a8.geometryUserPtr;
            }
            if (uVar23 != 2) {
              pSVar3 = pSVar18 + -3;
              uVar13 = pSVar18[-3].dist;
              if (uVar13 < pSVar18[-1].dist) {
                sVar11 = (pSVar3->ptr).ptr;
                uVar12 = *(undefined8 *)&pSVar18[-3].dist;
                pSVar18[-3].dist = pSVar18[-1].dist;
                (pSVar3->ptr).ptr = (pSVar2->ptr).ptr;
                (pSVar2->ptr).ptr = sVar11;
                local_11a8.geometryUserPtr._0_4_ = (uint)uVar12;
                pSVar18[-1].dist = (uint)local_11a8.geometryUserPtr;
                uVar13 = pSVar18[-3].dist;
              }
              if (uVar13 < pSVar18[-2].dist) {
                sVar11 = (pSVar3->ptr).ptr;
                uVar12 = *(undefined8 *)&pSVar18[-3].dist;
                pSVar18[-3].dist = pSVar18[-2].dist;
                (pSVar3->ptr).ptr = (pSVar1->ptr).ptr;
                (pSVar1->ptr).ptr = sVar11;
                local_11a8.geometryUserPtr._0_4_ = (uint)uVar12;
                pSVar18[-2].dist = (uint)local_11a8.geometryUserPtr;
              }
            }
          }
        }
        local_1068 = vcmpps_avx((undefined1  [16])bi_10.field_0,auVar31._0_16_,6);
        auVar31 = ZEXT1664(local_1068);
      } while ((((local_1068 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                (local_1068 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (local_1068 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               -1 < local_1068[0xf]);
      for (lVar21 = 0; auVar27 = auVar31._0_16_, (ulong)((uint)uVar14 & 0xf) - 8 != lVar21;
          lVar21 = lVar21 + 1) {
        local_11a8.geomID = *(uint *)((uVar14 & 0xfffffffffffffff0) + lVar21 * 8);
        local_1178 = (context->scene->geometries).items[local_11a8.geomID].ptr;
        uVar13 = local_1178->mask;
        auVar30._4_4_ = uVar13;
        auVar30._0_4_ = uVar13;
        auVar30._8_4_ = uVar13;
        auVar30._12_4_ = uVar13;
        auVar29 = vandps_avx(auVar30,*(undefined1 (*) [16])(ray + 0x90));
        auVar29 = vpcmpeqd_avx(auVar29,_DAT_01f45a50);
        auVar28 = auVar27 & ~auVar29;
        if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar28[0xf] < '\0') {
          fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vandnps_avx(auVar29,auVar27)
          ;
          local_11a8.primID = *(uint *)((uVar14 & 0xfffffffffffffff0) + 4 + lVar21 * 8);
          local_11a8.valid = (int *)&fmin;
          local_11a8.geometryUserPtr = local_1178->userPtr;
          local_11a8.context = context->user;
          local_11a8.N = 4;
          local_1170 = 0;
          local_1168 = context->args;
          pp_Var17 = (_func_int **)local_1168->intersect;
          if (pp_Var17 == (_func_int **)0x0) {
            pp_Var17 = local_1178[1].super_RefCount._vptr_RefCount;
          }
          local_11a8.rayhit = (RTCRayHitN *)ray;
          (*(code *)pp_Var17)(&local_11a8);
          auVar64 = ZEXT1664(local_1078);
          auVar65 = ZEXT1664(local_1088);
          auVar66 = ZEXT1664(local_1098);
          auVar67 = ZEXT1664(local_10a8);
          auVar68 = ZEXT1664(local_10b8);
          auVar63 = ZEXT1664(local_10c8);
          auVar61 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar31 = ZEXT1664(local_1068);
        }
      }
      auVar29 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),(undefined1  [16])bi_10.field_0,1);
      auVar29 = auVar27 & auVar29;
    } while ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar29[0xf]);
    bi_10.field_0 =
         (anon_union_16_2_9473010e_for_vint_impl<4>_1)
         vblendvps_avx((undefined1  [16])bi_10.field_0,*(undefined1 (*) [16])(ray + 0x80),auVar27);
    auVar27 = vshufps_avx((undefined1  [16])bi_10.field_0,(undefined1  [16])bi_10.field_0,0xb1);
    auVar27 = vmaxps_avx(auVar27,(undefined1  [16])bi_10.field_0);
    auVar29 = vshufpd_avx(auVar27,auVar27,1);
    auVar49 = vmaxss_avx(auVar29,auVar27);
  } while( true );
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }